

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect)

{
  byte bVar1;
  sqlite3 *db;
  Expr *pExpr;
  byte bVar2;
  LogEst LVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  CollSeq *pCVar8;
  ExprList_item *pEVar9;
  long lVar10;
  long lVar11;
  u8 *pEstWidth;
  NameContext sNC;
  NameContext local_68;
  
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  local_68.pNext = (NameContext *)0x0;
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.pEList = (ExprList *)0x0;
  local_68.pAggInfo = (AggInfo *)0x0;
  local_68.pParse = (Parse *)0x0;
  local_68.ncFlags = 0;
  local_68._50_6_ = 0;
  local_68.pSrcList = pSelect->pSrc;
  pEVar9 = pSelect->pEList->a;
  pEstWidth = &pTab->aCol->szEst;
  lVar11 = 0;
  for (lVar10 = 0; lVar10 < pTab->nCol; lVar10 = lVar10 + 1) {
    pExpr = pEVar9->pExpr;
    pcVar6 = columnTypeImpl(&local_68,pExpr,(char **)0x0,(char **)0x0,(char **)0x0,pEstWidth);
    bVar1 = *pEstWidth;
    bVar2 = sqlite3ExprAffinity(pExpr);
    pEstWidth[-1] = bVar2;
    if (pcVar6 != (char *)0x0) {
      iVar4 = sqlite3Strlen30(pcVar6);
      if (iVar4 != 0) {
        pcVar7 = ((Column *)(pEstWidth + -0x1a))->zName;
        uVar5 = sqlite3Strlen30(pcVar7);
        pcVar7 = (char *)sqlite3DbReallocOrFree(db,pcVar7,(ulong)(iVar4 + uVar5 + 2));
        ((Column *)(pEstWidth + -0x1a))->zName = pcVar7;
        if (pcVar7 != (char *)0x0) {
          memcpy(pcVar7 + (ulong)uVar5 + 1,pcVar6,(ulong)(iVar4 + 1));
          pEstWidth[1] = pEstWidth[1] | 4;
        }
        bVar2 = pEstWidth[-1];
      }
    }
    if (bVar2 == 0) {
      pEstWidth[-1] = 0x41;
    }
    pCVar8 = sqlite3ExprCollSeq(pParse,pExpr);
    if ((pCVar8 != (CollSeq *)0x0) && (*(char **)(pEstWidth + -10) == (char *)0x0)) {
      pcVar6 = sqlite3DbStrDup(db,pCVar8->zName);
      *(char **)(pEstWidth + -10) = pcVar6;
    }
    lVar11 = lVar11 + (ulong)bVar1;
    pEVar9 = pEVar9 + 1;
    pEstWidth = pEstWidth + 0x20;
  }
  LVar3 = sqlite3LogEst(lVar11 << 2);
  pTab->szTabRow = LVar3;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect       /* SELECT used to determine types and collations */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;
  u64 szAll = 0;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    int n, m;
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0, &pCol->szEst);
    szAll += pCol->szEst;
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType && (m = sqlite3Strlen30(zType))>0 ){
      n = sqlite3Strlen30(pCol->zName);
      pCol->zName = sqlite3DbReallocOrFree(db, pCol->zName, n+m+2);
      if( pCol->zName ){
        memcpy(&pCol->zName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    if( pCol->affinity==0 ) pCol->affinity = SQLITE_AFF_BLOB;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl && pCol->zColl==0 ){
      pCol->zColl = sqlite3DbStrDup(db, pColl->zName);
    }
  }
  pTab->szTabRow = sqlite3LogEst(szAll*4);
}